

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::PlotEx(ImGuiPlotType plot_type,char *label,_func_float_void_ptr_int *values_getter,
                  void *data,int values_count,int values_offset,char *overlay_text,float scale_min,
                  float scale_max,ImVec2 graph_size)

{
  ImVec4 *pIVar1;
  ImDrawList *this;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined1 auVar8 [16];
  ImGuiContext *pIVar9;
  _func_float_void_ptr_int *p_Var10;
  bool bVar11;
  ImU32 IVar12;
  int iVar13;
  ulong uVar14;
  int iVar15;
  ImU32 IVar16;
  uint uVar17;
  void *pvVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  uint in_XMM0_Db;
  ImVec2 IVar22;
  uint in_XMM0_Dc;
  uint in_XMM0_Dd;
  undefined1 auVar23 [16];
  float fVar24;
  float in_XMM2_Dc;
  float in_XMM2_Dd;
  float fVar25;
  uint uVar26;
  uint uVar27;
  ImVec2 pos1;
  ImVec2 pos0;
  ImRect inner_bb;
  ImRect total_bb;
  float local_198;
  float fStack_194;
  ImVec2 local_188;
  ImU32 local_17c;
  undefined1 local_178 [16];
  void *local_168;
  _func_float_void_ptr_int *local_160;
  ImVec4 local_158;
  ImGuiWindow *local_140;
  float local_138;
  undefined8 local_128;
  float fStack_120;
  float fStack_11c;
  float local_118;
  uint uStack_114;
  uint uStack_110;
  uint uStack_10c;
  ulong local_100;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float local_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  ImVec2 local_d8;
  ImVec2 local_c8;
  undefined8 uStack_c0;
  ImGuiContext *local_b8;
  char *local_b0;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  ImVec2 local_98;
  ImVec2 local_90;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  undefined8 local_68;
  undefined8 uStack_60;
  ImRect local_50;
  ImRect local_40;
  
  pIVar9 = GImGui;
  local_140 = GImGui->CurrentWindow;
  local_140->Accessed = true;
  if (local_140->SkipItems == false) {
    uVar14 = (ulong)(uint)values_offset;
    local_168 = data;
    local_138 = scale_max;
    local_118 = scale_min;
    uStack_114 = in_XMM0_Db;
    uStack_110 = in_XMM0_Dc;
    uStack_10c = in_XMM0_Dd;
    local_d8 = CalcTextSize(label,(char *)0x0,true,-1.0);
    local_198 = graph_size.x;
    fStack_194 = graph_size.y;
    if ((local_198 == 0.0) && (!NAN(local_198))) {
      fVar20 = (GImGui->CurrentWindow->DC).ItemWidth;
      if (fVar20 < 0.0) {
        local_178 = ZEXT416((uint)fVar20);
        IVar22 = GetContentRegionAvail();
        fVar24 = (float)local_178._0_4_ + IVar22.x;
        fVar20 = 1.0;
        if (1.0 <= fVar24) {
          fVar20 = fVar24;
        }
      }
      local_198 = (float)(int)fVar20;
    }
    if ((fStack_194 != 0.0) || (NAN(fStack_194))) {
      fVar20 = (pIVar9->Style).FramePadding.y;
    }
    else {
      fVar20 = (pIVar9->Style).FramePadding.y;
      fStack_194 = fVar20 + fVar20 + local_d8.y;
    }
    local_c8 = (local_140->DC).CursorPos;
    IVar22 = (local_140->DC).CursorPos;
    local_a8 = local_198 + IVar22.x;
    fStack_a4 = fStack_194 + IVar22.y;
    fStack_a0 = in_XMM2_Dc + 0.0;
    fStack_9c = in_XMM2_Dd + 0.0;
    fVar24 = (pIVar9->Style).FramePadding.x;
    local_e8 = local_a8 - fVar24;
    fStack_e4 = fStack_a4 - fVar20;
    fStack_e0 = fStack_a0 - 0.0;
    fStack_dc = fStack_9c - 0.0;
    uStack_c0 = 0;
    local_50.Min.x = fVar24 + local_c8.x;
    local_50.Min.y = fVar20 + local_c8.y;
    fStack_f0 = 0.0;
    fStack_ec = 0.0;
    local_50.Max.y = fStack_e4;
    local_50.Max.x = local_e8;
    fVar24 = 0.0;
    if (0.0 < local_d8.x) {
      fVar24 = (pIVar9->Style).ItemInnerSpacing.x + local_d8.x;
    }
    local_40.Max.y = fStack_a4 + 0.0;
    local_40.Max.x = fVar24 + local_a8;
    local_158.y = (fStack_a4 + 0.0) - local_c8.y;
    local_158.x = (fVar24 + local_a8) - local_c8.x;
    local_f8 = local_50.Min.x;
    fStack_f4 = local_50.Min.y;
    local_98 = local_c8;
    local_90.x = local_a8;
    local_90.y = fStack_a4;
    local_40.Min = local_c8;
    ItemSize((ImVec2 *)&local_158,fVar20);
    bVar11 = ItemAdd(&local_40,(ImGuiID *)0x0);
    pvVar18 = local_168;
    if (bVar11) {
      local_160 = values_getter;
      local_128 = uVar14;
      local_b0 = label;
      if (((local_118 == 3.4028235e+38) && (!NAN(local_118))) ||
         ((local_138 == 3.4028235e+38 && (!NAN(local_138))))) {
        if (values_count < 1) {
          fVar24 = -3.4028235e+38;
          fVar20 = 3.4028235e+38;
          uVar17 = 0;
          uVar26 = 0;
          uVar27 = 0;
        }
        else {
          iVar13 = 0;
          fVar24 = -3.4028235e+38;
          fVar20 = 3.4028235e+38;
          local_178._4_4_ = 0;
          local_178._8_4_ = 0;
          local_178._12_4_ = 0;
          do {
            local_178._0_4_ = fVar20;
            fVar19 = (*values_getter)(pvVar18,iVar13);
            fVar20 = (float)local_178._0_4_;
            if (fVar19 <= (float)local_178._0_4_) {
              fVar20 = fVar19;
            }
            fVar24 = (float)(-(uint)(fVar19 <= fVar24) & (uint)fVar24 |
                            ~-(uint)(fVar19 <= fVar24) & (uint)fVar19);
            iVar13 = iVar13 + 1;
            uVar17 = local_178._4_4_;
            uVar26 = local_178._8_4_;
            uVar27 = local_178._12_4_;
          } while (values_count != iVar13);
        }
        uStack_114 = uVar17 & uStack_114;
        uStack_110 = uVar26 & uStack_110;
        uStack_10c = uVar27 & uStack_10c;
        local_118 = (float)(~-(uint)(local_118 == 3.4028235e+38) & (uint)local_118 |
                           (uint)fVar20 & -(uint)(local_118 == 3.4028235e+38));
        local_138 = (float)(~-(uint)(local_138 == 3.4028235e+38) & (uint)local_138 |
                           (uint)fVar24 & -(uint)(local_138 == 3.4028235e+38));
        values_offset = (int)local_128;
      }
      local_158.x = (GImGui->Style).Colors[7].x;
      local_158.y = (GImGui->Style).Colors[7].y;
      uVar2 = (GImGui->Style).Colors[7].z;
      uVar3 = (GImGui->Style).Colors[7].w;
      local_158.w = (GImGui->Style).Alpha * (float)uVar3;
      local_158.z = (float)uVar2;
      IVar12 = ColorConvertFloat4ToU32(&local_158);
      IVar22.y = fStack_a4;
      IVar22.x = local_a8;
      RenderFrame(local_c8,IVar22,IVar12,true,(pIVar9->Style).FrameRounding);
      iVar13 = (int)local_198;
      if (values_count <= (int)local_198) {
        iVar13 = values_count;
      }
      local_178._0_4_ = values_count - (uint)(plot_type == ImGuiPlotType_Lines);
      bVar11 = IsHovered(&local_50,0,false);
      p_Var10 = local_160;
      pvVar18 = local_168;
      uVar14 = 0xffffffff;
      local_b8 = pIVar9;
      if (bVar11) {
        fVar24 = ((pIVar9->IO).MousePos.x - local_f8) / (local_e8 - local_f8);
        fVar20 = 0.9999;
        if (fVar24 <= 0.9999) {
          fVar20 = fVar24;
        }
        uVar17 = (uint)((float)(int)local_178._0_4_ * (float)(~-(uint)(fVar24 < 0.0) & (uint)fVar20)
                       );
        uVar14 = (ulong)uVar17;
        if (((int)uVar17 < 0) || (values_count <= (int)uVar17)) {
          __assert_fail("v_idx >= 0 && v_idx < values_count",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/imgui.cpp"
                        ,0x1bb1,
                        "void ImGui::PlotEx(ImGuiPlotType, const char *, float (*)(void *, int), void *, int, int, const char *, float, float, ImVec2)"
                       );
        }
        fVar20 = (*local_160)(local_168,(int)(uVar17 + values_offset) % values_count);
        (*p_Var10)(pvVar18,(int)(uVar17 + values_offset + 1) % values_count);
        if (plot_type == ImGuiPlotType_Lines) {
          SetTooltip("%d: %8.4g\n%d: %8.4g",(ulong)uVar17,(ulong)(uVar17 + 1));
        }
        else if (plot_type == ImGuiPlotType_Histogram) {
          SetTooltip("%d: %8.4g",(double)fVar20,(ulong)uVar17);
        }
      }
      pvVar18 = local_168;
      iVar13 = iVar13 - (uint)(plot_type == ImGuiPlotType_Lines);
      local_100 = uVar14;
      fVar24 = (*local_160)(local_168,
                            (int)((long)((ulong)(uint)((int)local_128 >> 0x1f) << 0x20 |
                                        local_128 & 0xffffffff) % (long)values_count));
      pIVar9 = GImGui;
      pIVar1 = (GImGui->Style).Colors + (ulong)(plot_type != ImGuiPlotType_Lines) * 2 + 0x25;
      local_158.x = pIVar1->x;
      local_158.y = pIVar1->y;
      uVar4 = pIVar1->z;
      uVar5 = pIVar1->w;
      fVar20 = (GImGui->Style).Alpha;
      local_158.w = (float)uVar5 * fVar20;
      local_158.z = (float)uVar4;
      local_17c = ColorConvertFloat4ToU32(&local_158);
      uVar14 = local_128;
      pIVar1 = (pIVar9->Style).Colors + (ulong)(plot_type != ImGuiPlotType_Lines) * 2 + 0x26;
      local_158.x = pIVar1->x;
      local_158.y = pIVar1->y;
      uVar6 = pIVar1->z;
      uVar7 = pIVar1->w;
      local_158.w = fVar20 * (float)uVar7;
      local_158.z = (float)uVar6;
      IVar12 = ColorConvertFloat4ToU32(&local_158);
      if (0 < iVar13) {
        local_68 = (ulong)(uint)(1.0 / (float)iVar13);
        uStack_60 = 0;
        local_138 = local_138 - local_118;
        fVar24 = (fVar24 - local_118) / local_138;
        fVar20 = 1.0;
        if (fVar24 <= 1.0) {
          fVar20 = fVar24;
        }
        fVar21 = (float)(int)local_178._0_4_;
        local_e8 = local_e8 - local_f8;
        fStack_e4 = fStack_e4 - fStack_f4;
        fStack_e0 = fStack_e0 - fStack_f0;
        fStack_dc = fStack_dc - fStack_ec;
        local_88 = fStack_f4;
        fStack_84 = fStack_f4;
        fStack_80 = fStack_f4;
        fStack_7c = fStack_f4;
        local_128 = CONCAT44(fStack_f4,fStack_f4 + fStack_e4);
        fStack_120 = fStack_f4;
        fStack_11c = fStack_f4;
        fVar19 = 0.0;
        fVar20 = (float)(-(uint)(fVar24 < 0.0) & 0x3f800000 |
                        ~-(uint)(fVar24 < 0.0) & (uint)(1.0 - fVar20));
        local_78 = fStack_e4;
        fStack_74 = fStack_e4;
        fStack_70 = fStack_e4;
        fStack_6c = fStack_e4;
        do {
          iVar15 = (int)(fVar19 * fVar21 + 0.5);
          if ((iVar15 < 0) || (values_count <= iVar15)) {
            __assert_fail("v1_idx >= 0 && v1_idx < values_count",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/imgui.cpp"
                          ,0x1bc9,
                          "void ImGui::PlotEx(ImGuiPlotType, const char *, float (*)(void *, int), void *, int, int, const char *, float, float, ImVec2)"
                         );
          }
          local_178._4_4_ = local_68._4_4_;
          local_178._0_4_ = (float)local_68 + fVar19;
          local_178._8_4_ = (undefined4)uStack_60;
          local_178._12_4_ = uStack_60._4_4_;
          fVar24 = (*local_160)(pvVar18,((int)uVar14 + 1 + iVar15) % values_count);
          fVar25 = (fVar24 - local_118) / local_138;
          fVar24 = 1.0;
          if (fVar25 <= 1.0) {
            fVar24 = fVar25;
          }
          fVar24 = (float)(-(uint)(fVar25 < 0.0) & 0x3f800000 |
                          ~-(uint)(fVar25 < 0.0) & (uint)(1.0 - fVar24));
          local_158.x = fVar19 * local_e8 + local_f8;
          local_158.y = fVar20 * fStack_e4 + fStack_f4;
          local_188.x = local_e8 * (float)local_178._0_4_ + local_f8;
          if (plot_type == ImGuiPlotType_Lines) {
            local_188.y = local_78 * fVar24 + local_88;
            IVar16 = local_17c;
            if ((int)local_100 == iVar15) {
              IVar16 = IVar12;
            }
            ImDrawList::AddLine(local_140->DrawList,(ImVec2 *)&local_158,&local_188,IVar16,1.0);
          }
          else {
            local_188.y = (float)local_128;
            if (plot_type == ImGuiPlotType_Histogram) {
              if (local_158.x + 2.0 <= local_188.x) {
                local_188.x = local_188.x + -1.0;
              }
              IVar16 = local_17c;
              if ((int)local_100 == iVar15) {
                IVar16 = IVar12;
              }
              if (0xffffff < IVar16) {
                this = local_140->DrawList;
                ImDrawList::PrimReserve(this,6,4);
                pvVar18 = local_168;
                ImDrawList::PrimRect(this,(ImVec2 *)&local_158,&local_188,IVar16);
              }
            }
          }
          iVar13 = iVar13 + -1;
          fVar19 = (float)local_178._0_4_;
          fVar20 = fVar24;
        } while (iVar13 != 0);
      }
      pIVar9 = local_b8;
      if (overlay_text != (char *)0x0) {
        local_158.y = local_c8.y + (local_b8->Style).FramePadding.y;
        local_158.x = local_c8.x;
        local_188.x = 0.5;
        local_188.y = 0.0;
        RenderTextClipped((ImVec2 *)&local_158,&local_90,overlay_text,(char *)0x0,(ImVec2 *)0x0,
                          &local_188,(ImRect *)0x0);
      }
      if (0.0 < local_d8.x) {
        auVar8._4_4_ = fStack_f4;
        auVar8._0_4_ = local_f8;
        auVar8._8_4_ = fStack_f0;
        auVar8._12_4_ = fStack_ec;
        auVar23._4_12_ = auVar8._4_12_;
        auVar23._0_4_ = local_a8 + (pIVar9->Style).ItemInnerSpacing.x;
        RenderText(auVar23._0_8_,local_b0,(char *)0x0,true);
      }
    }
  }
  return;
}

Assistant:

void ImGui::PlotEx(ImGuiPlotType plot_type, const char* label, float (*values_getter)(void* data, int idx), void* data, int values_count, int values_offset, const char* overlay_text, float scale_min, float scale_max, ImVec2 graph_size)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return;

    ImGuiContext& g = *GImGui;
    const ImGuiStyle& style = g.Style;

    const ImVec2 label_size = CalcTextSize(label, NULL, true);
    if (graph_size.x == 0.0f)
        graph_size.x = CalcItemWidth();
    if (graph_size.y == 0.0f)
        graph_size.y = label_size.y + (style.FramePadding.y * 2);

    const ImRect frame_bb(window->DC.CursorPos, window->DC.CursorPos + ImVec2(graph_size.x, graph_size.y));
    const ImRect inner_bb(frame_bb.Min + style.FramePadding, frame_bb.Max - style.FramePadding);
    const ImRect total_bb(frame_bb.Min, frame_bb.Max + ImVec2(label_size.x > 0.0f ? style.ItemInnerSpacing.x + label_size.x : 0.0f, 0));
    ItemSize(total_bb, style.FramePadding.y);
    if (!ItemAdd(total_bb, NULL))
        return;

    // Determine scale from values if not specified
    if (scale_min == FLT_MAX || scale_max == FLT_MAX)
    {
        float v_min = FLT_MAX;
        float v_max = -FLT_MAX;
        for (int i = 0; i < values_count; i++)
        {
            const float v = values_getter(data, i);
            v_min = ImMin(v_min, v);
            v_max = ImMax(v_max, v);
        }
        if (scale_min == FLT_MAX)
            scale_min = v_min;
        if (scale_max == FLT_MAX)
            scale_max = v_max;
    }

    RenderFrame(frame_bb.Min, frame_bb.Max, GetColorU32(ImGuiCol_FrameBg), true, style.FrameRounding);

    int res_w = ImMin((int)graph_size.x, values_count) + ((plot_type == ImGuiPlotType_Lines) ? -1 : 0);
    int item_count = values_count + ((plot_type == ImGuiPlotType_Lines) ? -1 : 0);

    // Tooltip on hover
    int v_hovered = -1;
    if (IsHovered(inner_bb, 0))
    {
        const float t = ImClamp((g.IO.MousePos.x - inner_bb.Min.x) / (inner_bb.Max.x - inner_bb.Min.x), 0.0f, 0.9999f);
        const int v_idx = (int)(t * item_count);
        IM_ASSERT(v_idx >= 0 && v_idx < values_count);

        const float v0 = values_getter(data, (v_idx + values_offset) % values_count);
        const float v1 = values_getter(data, (v_idx + 1 + values_offset) % values_count);
        if (plot_type == ImGuiPlotType_Lines)
            SetTooltip("%d: %8.4g\n%d: %8.4g", v_idx, v0, v_idx+1, v1);
        else if (plot_type == ImGuiPlotType_Histogram)
            SetTooltip("%d: %8.4g", v_idx, v0);
        v_hovered = v_idx;
    }

    const float t_step = 1.0f / (float)res_w;

    float v0 = values_getter(data, (0 + values_offset) % values_count);
    float t0 = 0.0f;
    ImVec2 tp0 = ImVec2( t0, 1.0f - ImSaturate((v0 - scale_min) / (scale_max - scale_min)) );    // Point in the normalized space of our target rectangle

    const ImU32 col_base = GetColorU32((plot_type == ImGuiPlotType_Lines) ? ImGuiCol_PlotLines : ImGuiCol_PlotHistogram);
    const ImU32 col_hovered = GetColorU32((plot_type == ImGuiPlotType_Lines) ? ImGuiCol_PlotLinesHovered : ImGuiCol_PlotHistogramHovered);

    for (int n = 0; n < res_w; n++)
    {
        const float t1 = t0 + t_step;
        const int v1_idx = (int)(t0 * item_count + 0.5f);
        IM_ASSERT(v1_idx >= 0 && v1_idx < values_count);
        const float v1 = values_getter(data, (v1_idx + values_offset + 1) % values_count);
        const ImVec2 tp1 = ImVec2( t1, 1.0f - ImSaturate((v1 - scale_min) / (scale_max - scale_min)) );

        // NB: Draw calls are merged together by the DrawList system. Still, we should render our batch are lower level to save a bit of CPU.
        ImVec2 pos0 = ImLerp(inner_bb.Min, inner_bb.Max, tp0);
        ImVec2 pos1 = ImLerp(inner_bb.Min, inner_bb.Max, (plot_type == ImGuiPlotType_Lines) ? tp1 : ImVec2(tp1.x, 1.0f));
        if (plot_type == ImGuiPlotType_Lines)
        {
            window->DrawList->AddLine(pos0, pos1, v_hovered == v1_idx ? col_hovered : col_base);
        }
        else if (plot_type == ImGuiPlotType_Histogram)
        {
            if (pos1.x >= pos0.x + 2.0f)
                pos1.x -= 1.0f;
            window->DrawList->AddRectFilled(pos0, pos1, v_hovered == v1_idx ? col_hovered : col_base);
        }

        t0 = t1;
        tp0 = tp1;
    }

    // Text overlay
    if (overlay_text)
        RenderTextClipped(ImVec2(frame_bb.Min.x, frame_bb.Min.y + style.FramePadding.y), frame_bb.Max, overlay_text, NULL, NULL, ImVec2(0.5f,0.0f));

    if (label_size.x > 0.0f)
        RenderText(ImVec2(frame_bb.Max.x + style.ItemInnerSpacing.x, inner_bb.Min.y), label);
}